

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getPassThroughFragmentShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType sampler_type,
          string *out_fragment_shader_code)

{
  ostream *poVar1;
  string local_1f8 [51];
  bool local_1c5;
  GLuint local_1c4;
  bool ignored_is_shadow;
  GLuint ignored_n_components;
  GLchar *ignored_sampler_type;
  GLchar *interpolation_type;
  GLchar *color_type;
  stringstream stream;
  ostream local_198;
  string *local_20;
  string *out_fragment_shader_code_local;
  TextureCubeMapArraySamplingTest *pTStack_10;
  samplerType sampler_type_local;
  TextureCubeMapArraySamplingTest *this_local;
  
  local_20 = out_fragment_shader_code;
  out_fragment_shader_code_local._4_4_ = sampler_type;
  pTStack_10 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&color_type);
  getColorType(this,out_fragment_shader_code_local._4_4_,&interpolation_type,&ignored_sampler_type,
               (GLchar **)&stack0xfffffffffffffe40,&local_1c4,&local_1c5);
  poVar1 = std::operator<<(&local_198,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n");
  poVar1 = std::operator<<(poVar1,"precision highp float;\n");
  poVar1 = std::operator<<(poVar1,"/* Pass through fragment shader */");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(&local_198,ignored_sampler_type);
  poVar1 = std::operator<<(poVar1,"in ");
  poVar1 = std::operator<<(poVar1,interpolation_type);
  poVar1 = std::operator<<(poVar1,"fs_in_color");
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&local_198,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(&local_198,"layout(location = 0) ");
  poVar1 = std::operator<<(poVar1,"out ");
  poVar1 = std::operator<<(poVar1,interpolation_type);
  poVar1 = std::operator<<(poVar1,"fs_out_color");
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&local_198,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(&local_198,"void main()\n{\n    fs_out_color = fs_in_color;\n}\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)local_20,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&color_type);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getPassThroughFragmentShaderCode(samplerType  sampler_type,
																	   std::string& out_fragment_shader_code)
{
	std::stringstream  stream;
	const glw::GLchar* color_type;
	const glw::GLchar* interpolation_type;
	const glw::GLchar* ignored_sampler_type;
	glw::GLuint		   ignored_n_components;
	bool			   ignored_is_shadow;

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, ignored_sampler_type, ignored_n_components,
				 ignored_is_shadow);

	/* Preamble */
	stream << shader_code_preamble << shader_precision << "/* Pass through fragment shader */" << std::endl;

	/* in vec4 fs_in_color */
	stream << interpolation_type << shader_input << color_type << fragment_shader_input << ";" << std::endl;

	stream << std::endl;

	/* layout(location = 0) out vec4 fs_out_color */
	stream << shader_layout << shader_output << color_type << fragment_shader_output << ";" << std::endl;

	stream << std::endl;

	/* Body */
	stream << fragment_shader_pass_through_body_code << std::endl;

	/* Store result */
	out_fragment_shader_code = stream.str();
}